

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::_abi_1_10::BaseRAPass::onPerformAllSteps(BaseRAPass *this)

{
  Error EVar1;
  
  EVar1 = (*(this->super_FuncPass).super_Pass._vptr_Pass[6])();
  if (EVar1 == 0) {
    EVar1 = buildCFGViews(this);
    if (EVar1 == 0) {
      removeUnreachableCode(this);
      buildCFGDominators(this);
      EVar1 = buildLiveness(this);
      if (EVar1 == 0) {
        assignArgIndexToWorkRegs(this);
        if ((this->_diagnosticOptions & kRAAnnotate) != kNone) {
          annotateCode(this);
        }
        EVar1 = runGlobalAllocator(this);
        if (EVar1 == 0) {
          EVar1 = runLocalAllocator(this);
          if (EVar1 == 0) {
            EVar1 = (*(this->super_FuncPass).super_Pass._vptr_Pass[7])(this);
            if (EVar1 == 0) {
              EVar1 = insertPrologEpilog(this);
              if (EVar1 == 0) {
                EVar1 = rewrite(this);
                return EVar1;
              }
            }
          }
        }
      }
    }
  }
  return EVar1;
}

Assistant:

Error BaseRAPass::onPerformAllSteps() noexcept {
  ASMJIT_PROPAGATE(buildCFG());
  ASMJIT_PROPAGATE(buildCFGViews());
  ASMJIT_PROPAGATE(removeUnreachableCode());

  ASMJIT_PROPAGATE(buildCFGDominators());
  ASMJIT_PROPAGATE(buildLiveness());
  ASMJIT_PROPAGATE(assignArgIndexToWorkRegs());

#ifndef ASMJIT_NO_LOGGING
  if (hasDiagnosticOption(DiagnosticOptions::kRAAnnotate))
    ASMJIT_PROPAGATE(annotateCode());
#endif

  ASMJIT_PROPAGATE(runGlobalAllocator());
  ASMJIT_PROPAGATE(runLocalAllocator());

  ASMJIT_PROPAGATE(updateStackFrame());
  ASMJIT_PROPAGATE(insertPrologEpilog());

  ASMJIT_PROPAGATE(rewrite());

  return kErrorOk;
}